

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O1

bool slang::ast::builtins::ArrayQueryFunction::checkDim
               (ASTContext *context,Args *args,int32_t *resultIndex)

{
  bool bVar1;
  bool bVar2;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this;
  optional<int> oVar3;
  Diagnostic *pDVar4;
  Type *this_00;
  int iVar5;
  _Storage<int,_true> _Var6;
  anon_class_24_3_8c0f11e8 error;
  ConstantValue iv;
  anon_class_24_3_8c0f11e8 local_78;
  ASTContext *local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  ASTContext::tryEval((ConstantValue *)&local_58,context,args->_M_ptr[1]);
  if (local_58._M_index == '\0') {
    bVar2 = true;
    goto LAB_004aba73;
  }
  local_78.context = context;
  local_78.args = args;
  local_78.iv = (ConstantValue *)&local_58;
  this = std::
         get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                   ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)&local_58);
  oVar3 = SVInt::as<int>(this);
  _Var6._M_value =
       oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_payload;
  if ((oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
       _M_engaged & 0 < _Var6._M_value) == 0) {
    pDVar4 = ASTContext::addDiag(local_78.context,(DiagCode)0x6000b,
                                 (local_78.args)->_M_ptr[1]->sourceRange);
    pDVar4 = Diagnostic::operator<<(pDVar4,local_78.iv);
    ast::operator<<(pDVar4,((*(local_78.args)->_M_ptr)->type).ptr);
  }
  else {
    *resultIndex = (int32_t)_Var6;
    this_00 = ((*args->_M_ptr)->type).ptr;
    bVar2 = 1 < _Var6._M_value;
    local_60 = context;
    if (1 < _Var6._M_value) {
      iVar5 = 1;
      do {
        bVar1 = Type::isArray(this_00);
        if (!bVar1) {
          pDVar4 = ASTContext::addDiag(local_78.context,(DiagCode)0x6000b,
                                       (local_78.args)->_M_ptr[1]->sourceRange);
          pDVar4 = Diagnostic::operator<<(pDVar4,local_78.iv);
          ast::operator<<(pDVar4,((*(local_78.args)->_M_ptr)->type).ptr);
          if (bVar2) goto LAB_004aba6c;
          break;
        }
        this_00 = Type::getArrayElementType(this_00);
        bVar2 = iVar5 < _Var6._M_value + -1;
        iVar5 = iVar5 + 1;
      } while (_Var6._M_value != iVar5);
    }
    bVar2 = Type::hasFixedRange(this_00);
    if (bVar2) {
      if (this_00->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_00);
      }
      bVar2 = true;
      if ((this_00->canonical->super_Symbol).kind != ScalarType) goto LAB_004aba73;
    }
    if (this_00->canonical == (Type *)0x0) {
      Type::resolveCanonical(this_00);
    }
    if (((this_00->canonical->super_Symbol).kind != StringType) &&
       (bVar2 = Type::isUnpackedArray(this_00), !bVar2)) {
      bVar2 = checkDim::anon_class_24_3_8c0f11e8::operator()(&local_78);
      goto LAB_004aba73;
    }
    bVar2 = true;
    if (_Var6._M_value == 1) goto LAB_004aba73;
    pDVar4 = ASTContext::addDiag(local_60,(DiagCode)0x7000b,(*args->_M_ptr)->sourceRange);
    pDVar4 = Diagnostic::operator<<(pDVar4,(ConstantValue *)&local_58);
    Diagnostic::operator<<(pDVar4,args->_M_ptr[1]->sourceRange);
  }
LAB_004aba6c:
  bVar2 = false;
LAB_004aba73:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  return bVar2;
}

Assistant:

static bool checkDim(const ASTContext& context, const Args& args, int32_t& resultIndex) {
        // Similar logic to what's above, except we're just verifying a constant index here.
        // It's ok for it not to be constant, it will be evaluated at runtime.
        ConstantValue iv = context.tryEval(*args[1]);
        if (!iv)
            return true;

        auto error = [&] {
            context.addDiag(diag::DimensionIndexInvalid, args[1]->sourceRange)
                << iv << *args[0]->type;
            return false;
        };

        std::optional<int32_t> index = iv.integer().as<int32_t>();
        if (!index || *index <= 0)
            return error();

        resultIndex = *index;
        const Type* type = args[0]->type;
        for (int32_t i = 0; i < *index - 1; i++) {
            if (!type->isArray())
                return error();
            type = type->getArrayElementType();
        }

        if (type->hasFixedRange() && !type->isScalar())
            return true;

        if (!type->isString() && !type->isUnpackedArray())
            return error();

        if (*index != 1) {
            context.addDiag(diag::DynamicDimensionIndex, args[0]->sourceRange)
                << iv << args[1]->sourceRange;
            return false;
        }

        return true;
    }